

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_ReleaseString_Test::TestBody(ArenaTest_ReleaseString_Test *this)

{
  bool bVar1;
  TestAllTypes *this_00;
  uint32_t *puVar2;
  Arena *arena_00;
  string *__p;
  type rhs;
  char *message;
  AssertHelper local_110;
  Message local_108;
  undefined1 local_100 [8];
  AssertionResult gtest_ar;
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  released_str;
  TestAllTypes *arena_message;
  Arena arena;
  ArenaTest_ReleaseString_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&arena_message);
  this_00 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena_message);
  puVar2 = internal::HasBits<2>::operator[](&(this_00->field_0)._impl_._has_bits_,0);
  *(byte *)puVar2 = (byte)*puVar2 | 1;
  arena_00 = protobuf::MessageLite::GetArena((MessageLite *)this_00);
  internal::ArenaStringPtr::Set(&(this_00->field_0)._impl_.optional_string_,"hello",arena_00);
  __p = proto2_unittest::TestAllTypes::release_optional_string_abi_cxx11_(this_00);
  std::unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>>::
  unique_ptr<std::default_delete<std::__cxx11::string>,void>
            ((unique_ptr<std::__cxx11::string,std::default_delete<std::__cxx11::string>> *)
             &gtest_ar.message_,__p);
  rhs = std::
        unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::operator*(&gtest_ar.message_);
  testing::internal::EqHelper::
  Compare<char[6],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
            ((EqHelper *)local_100,"\"hello\"","*released_str",(char (*) [6])0x1eb200f,rhs);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              (&local_110,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x31e,message);
    testing::internal::AssertHelper::operator=(&local_110,&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_110);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  Arena::~Arena((Arena *)&arena_message);
  return;
}

Assistant:

TEST(ArenaTest, ReleaseString) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->set_optional_string("hello");
  std::unique_ptr<std::string> released_str(
      arena_message->release_optional_string());
  EXPECT_EQ("hello", *released_str);

  // Test default value.
}